

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

bool __thiscall draco::ObjDecoder::ParseDefinition(ObjDecoder *this,Status *status)

{
  bool bVar1;
  DecoderBuffer *this_00;
  ObjDecoder *in_RDI;
  char c;
  Status *in_stack_00000060;
  ObjDecoder *in_stack_00000068;
  Status *in_stack_00000090;
  ObjDecoder *in_stack_00000098;
  Status *in_stack_000000a0;
  ObjDecoder *in_stack_000000a8;
  Status *in_stack_00000140;
  ObjDecoder *in_stack_00000148;
  undefined7 in_stack_ffffffffffffffe0;
  char in_stack_ffffffffffffffe7;
  bool local_1;
  
  buffer(in_RDI);
  parser::SkipWhitespace
            ((DecoderBuffer *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  this_00 = buffer(in_RDI);
  bVar1 = DecoderBuffer::Peek<char>(this_00,&stack0xffffffffffffffe7);
  if (bVar1) {
    if (in_stack_ffffffffffffffe7 == '#') {
      buffer(in_RDI);
      parser::SkipLine((DecoderBuffer *)0x1166b3);
      local_1 = true;
    }
    else {
      bVar1 = ParseVertexPosition(in_stack_00000068,in_stack_00000060);
      if (bVar1) {
        local_1 = true;
      }
      else {
        bVar1 = ParseNormal(in_stack_00000068,in_stack_00000060);
        if (bVar1) {
          local_1 = true;
        }
        else {
          bVar1 = ParseTexCoord(in_stack_00000068,in_stack_00000060);
          if (bVar1) {
            local_1 = true;
          }
          else {
            bVar1 = ParseFace(in_stack_00000148,in_stack_00000140);
            if (bVar1) {
              local_1 = true;
            }
            else {
              bVar1 = ParseMaterial(in_stack_00000098,in_stack_00000090);
              if (bVar1) {
                local_1 = true;
              }
              else {
                bVar1 = ParseMaterialLib(in_stack_000000a8,in_stack_000000a0);
                if (bVar1) {
                  local_1 = true;
                }
                else {
                  bVar1 = ParseObject(in_stack_000000a8,in_stack_000000a0);
                  if (bVar1) {
                    local_1 = true;
                  }
                  else {
                    buffer(in_RDI);
                    parser::SkipLine((DecoderBuffer *)0x116794);
                    local_1 = true;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ObjDecoder::ParseDefinition(Status *status) {
  char c;
  parser::SkipWhitespace(buffer());
  if (!buffer()->Peek(&c)) {
    // End of file reached?.
    return false;
  }
  if (c == '#') {
    // Comment, ignore the line.
    parser::SkipLine(buffer());
    return true;
  }
  if (ParseVertexPosition(status)) {
    return true;
  }
  if (ParseNormal(status)) {
    return true;
  }
  if (ParseTexCoord(status)) {
    return true;
  }
  if (ParseFace(status)) {
    return true;
  }
  if (ParseMaterial(status)) {
    return true;
  }
  if (ParseMaterialLib(status)) {
    return true;
  }
  if (ParseObject(status)) {
    return true;
  }
  // No known definition was found. Ignore the line.
  parser::SkipLine(buffer());
  return true;
}